

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall google::protobuf::Message::CopyFrom(Message *this,Message *from)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  LogMessage *pLVar4;
  undefined4 extraout_var_03;
  code *pcVar5;
  LogFinisher local_59;
  LogMessage local_58;
  undefined8 *puVar3;
  
  if (from != this) {
    iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])();
    puVar3 = (undefined8 *)CONCAT44(extraout_var,iVar1);
    iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[0x12])(from);
    if ((puVar3 == (undefined8 *)0x0) || (puVar3 != (undefined8 *)CONCAT44(extraout_var_00,iVar1)))
    {
      iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
      iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[0x11])(from);
      if (CONCAT44(extraout_var_02,iVar2) != CONCAT44(extraout_var_01,iVar1)) {
        internal::LogMessage::LogMessage
                  (&local_58,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
                   ,0x6a);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_58,"CHECK failed: (from.GetDescriptor()) == (descriptor): ");
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,": Tried to copy from a message with a different type. to: ");
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,(string *)(*(long *)(CONCAT44(extraout_var_01,iVar1) + 8) + 0x20)
                           );
        pLVar4 = internal::LogMessage::operator<<(pLVar4,", from: ");
        iVar1 = (*(from->super_MessageLite)._vptr_MessageLite[0x11])(from);
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,(string *)(*(long *)(CONCAT44(extraout_var_03,iVar1) + 8) + 0x20)
                           );
        internal::LogFinisher::operator=(&local_59,pLVar4);
        internal::LogMessage::~LogMessage(&local_58);
      }
      pcVar5 = CopyFrom(google::protobuf::Message_const&)::$_0::__invoke(google::protobuf::
               Message*,google::protobuf::Message_const__;
    }
    else {
      pcVar5 = (code *)*puVar3;
    }
    (*pcVar5)(this,from);
  }
  return;
}

Assistant:

void Message::CopyFrom(const Message& from) {
  if (&from == this) return;

  auto* class_to = GetClassData();
  auto* class_from = from.GetClassData();
  auto* copy_to_from = class_to ? class_to->copy_to_from : nullptr;

  if (class_to == nullptr || class_to != class_from) {
    const Descriptor* descriptor = GetDescriptor();
    GOOGLE_CHECK_EQ(from.GetDescriptor(), descriptor)
        << ": Tried to copy from a message with a different type. "
           "to: "
        << descriptor->full_name()
        << ", "
           "from: "
        << from.GetDescriptor()->full_name();
    copy_to_from = [](Message* to, const Message& from) {
      ReflectionOps::Copy(from, to);
    };
  }
  copy_to_from(this, from);
}